

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ColladaParser(ColladaParser *this,IOSystem *pIOHandler,string *pFile)

{
  string *pFile_00;
  string *this_00;
  bool bVar1;
  int iVar2;
  DeadlyImportError *pDVar3;
  ZipArchiveIOSystem *this_01;
  ColladaParser *this_02;
  ulong uVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  IOStream *__p;
  pointer pIVar6;
  CIrrXML_IOStreamReader *this_03;
  pointer callback;
  IrrXMLReader *pIVar7;
  pointer pZVar8;
  type zip_archive_00;
  ZipArchiveIOSystem *zip_archive_01;
  char *num_bytes;
  allocator<char> local_219;
  string local_218;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  local_1f8;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  mIOWrapper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string dae_filename;
  string extension;
  unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  zip_archive;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> daefile;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *pFile_local;
  IOSystem *pIOHandler_local;
  ColladaParser *this_local;
  
  local_20 = pFile;
  pFile_local = (string *)pIOHandler;
  pIOHandler_local = (IOSystem *)this;
  std::__cxx11::string::string((string *)this,(string *)pFile);
  this->mReader = (IrrXMLReader *)0x0;
  memset(&this->mDataLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
  ::map(&this->mDataLibrary);
  memset(&this->mAccessorLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
  ::map(&this->mAccessorLibrary);
  memset(&this->mMeshLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
  ::map(&this->mMeshLibrary);
  memset(&this->mNodeLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
  ::map(&this->mNodeLibrary);
  memset(&this->mImageLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
  ::map(&this->mImageLibrary);
  memset(&this->mEffectLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
  ::map(&this->mEffectLibrary);
  memset(&this->mMaterialLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
  ::map(&this->mMaterialLibrary);
  memset(&this->mLightLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
  ::map(&this->mLightLibrary);
  memset(&this->mCameraLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
  ::map(&this->mCameraLibrary);
  memset(&this->mControllerLibrary,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
  ::map(&this->mControllerLibrary);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>_>_>
  ::map(&this->mAnimationLibrary);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector(&this->mAnimationClipLibrary);
  this->mRootNode = (Node *)0x0;
  memset(&this->mAnims,0,0x50);
  Collada::Animation::Animation(&this->mAnims);
  this->mUnitSize = 1.0;
  this->mUpDirection = UP_Y;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
  ::map(&this->mAssetMetaData);
  this->mFormat = FV_1_5_n;
  if (pFile_local == (string *)0x0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"IOSystem is NULL.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_40);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&zip_archive);
  std::unique_ptr<Assimp::ZipArchiveIOSystem,std::default_delete<Assimp::ZipArchiveIOSystem>>::
  unique_ptr<std::default_delete<Assimp::ZipArchiveIOSystem>,void>
            ((unique_ptr<Assimp::ZipArchiveIOSystem,std::default_delete<Assimp::ZipArchiveIOSystem>>
              *)(extension.field_2._M_local_buf + 8));
  BaseImporter::GetExtension((string *)((long)&dae_filename.field_2 + 8),local_20);
  num_bytes = "dae";
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&dae_filename.field_2 + 8),"dae");
  if (bVar1) {
    this_01 = (ZipArchiveIOSystem *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x28,(size_t)num_bytes);
    ZipArchiveIOSystem::ZipArchiveIOSystem(this_01,(IOSystem *)pFile_local,local_20,"r");
    std::unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>::
    reset((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           *)((long)&extension.field_2 + 8),this_01);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(extension.field_2._M_local_buf + 8))
  ;
  if (bVar1) {
    pZVar8 = std::
             unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             ::operator->((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                           *)((long)&extension.field_2 + 8));
    bVar1 = ZipArchiveIOSystem::isOpen(pZVar8);
    if (bVar1) {
      this_02 = (ColladaParser *)
                std::
                unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                ::operator*((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                             *)((long)&extension.field_2 + 8));
      ReadZaeManifest_abi_cxx11_((string *)local_a8,this_02,zip_archive_01);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"Invalid ZAE",&local_c9);
        ThrowException(this,&local_c8);
      }
      pZVar8 = std::
               unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ::operator->((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                             *)((long)&extension.field_2 + 8));
      uVar5 = std::__cxx11::string::c_str();
      iVar2 = (*(pZVar8->super_IOSystem)._vptr_IOSystem[4])(pZVar8,uVar5,"rb");
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::reset
                ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                 &zip_archive,(pointer)CONCAT44(extraout_var,iVar2));
      bVar1 = std::operator==((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                               *)&zip_archive,(nullptr_t)0x0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Invalid ZAE manifest: \'",&local_131);
        std::__cxx11::string::string((string *)&local_158,(string *)local_a8);
        std::operator+(&local_110,&local_130,&local_158);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"\' is missing",&local_179);
        std::operator+(&local_f0,&local_110,&local_178);
        ThrowException(this,&local_f0);
      }
      std::__cxx11::string::~string((string *)local_a8);
      goto LAB_0066ed1e;
    }
  }
  this_00 = pFile_local;
  pFile_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"rb",&local_1a1);
  __p = IOSystem::Open((IOSystem *)this_00,pFile_00,&local_1a0);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::reset
            ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)&zip_archive,
             __p);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  pIVar6 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                     ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                      &zip_archive);
  if (pIVar6 == (pointer)0x0) {
    mIOWrapper._M_t.
    super___uniq_ptr_impl<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::CIrrXML_IOStreamReader_*,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    .super__Head_base<0UL,_Assimp::CIrrXML_IOStreamReader_*,_false>._M_head_impl._7_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1e8,"Failed to open file \'",local_20);
    std::operator+(&local_1c8,&local_1e8,"\'.");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_1c8);
    mIOWrapper._M_t.
    super___uniq_ptr_impl<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::CIrrXML_IOStreamReader_*,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    .super__Head_base<0UL,_Assimp::CIrrXML_IOStreamReader_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
LAB_0066ed1e:
  this_03 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  pIVar6 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                     ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                      &zip_archive);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_03,pIVar6);
  std::
  unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>::
  unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
            ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
              *)&local_1f8,this_03);
  callback = std::
             unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
             ::get(&local_1f8);
  pIVar7 = irr::io::createIrrXMLReader(&callback->super_IFileReadCallBack);
  this->mReader = pIVar7;
  if (this->mReader != (IrrXMLReader *)0x0) {
    ReadContents(this);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)(extension.field_2._M_local_buf + 8));
    if (bVar1) {
      pZVar8 = std::
               unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ::operator->((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                             *)((long)&extension.field_2 + 8));
      bVar1 = ZipArchiveIOSystem::isOpen(pZVar8);
      if (bVar1) {
        zip_archive_00 =
             std::
             unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             ::operator*((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                          *)((long)&extension.field_2 + 8));
        ReadEmbeddedTextures(this,zip_archive_00);
      }
    }
    std::
    unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    ::~unique_ptr(&local_1f8);
    std::__cxx11::string::~string((string *)(dae_filename.field_2._M_local_buf + 8));
    std::unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>::
    ~unique_ptr((unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 *)((long)&extension.field_2 + 8));
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)&zip_archive)
    ;
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Unable to read file, malformed XML",&local_219);
  ThrowException(this,&local_218);
}

Assistant:

ColladaParser::ColladaParser(IOSystem* pIOHandler, const std::string& pFile)
    : mFileName(pFile)
    , mReader(nullptr)
    , mDataLibrary()
    , mAccessorLibrary()
    , mMeshLibrary()
    , mNodeLibrary()
    , mImageLibrary()
    , mEffectLibrary()
    , mMaterialLibrary()
    , mLightLibrary()
    , mCameraLibrary()
    , mControllerLibrary()
    , mRootNode(nullptr)
    , mAnims()
    , mUnitSize(1.0f)
    , mUpDirection(UP_Y)
    , mFormat(FV_1_5_n)    // We assume the newest file format by default
{
    // validate io-handler instance
    if (nullptr == pIOHandler) {
        throw DeadlyImportError("IOSystem is NULL.");
    }

    std::unique_ptr<IOStream> daefile;
    std::unique_ptr<ZipArchiveIOSystem> zip_archive;

    // Determine type
    std::string extension = BaseImporter::GetExtension(pFile);
    if (extension != "dae") {
        zip_archive.reset(new ZipArchiveIOSystem(pIOHandler, pFile));
    }

    if (zip_archive && zip_archive->isOpen()) {
        std::string dae_filename = ReadZaeManifest(*zip_archive);

        if (dae_filename.empty()) {
            ThrowException(std::string("Invalid ZAE"));
        }

        daefile.reset(zip_archive->Open(dae_filename.c_str()));
        if (daefile == nullptr) {
            ThrowException(std::string("Invalid ZAE manifest: '") + std::string(dae_filename) + std::string("' is missing"));
        }
    }
    else {
        // attempt to open the file directly
        daefile.reset(pIOHandler->Open(pFile));
        if (daefile.get() == nullptr) {
            throw DeadlyImportError("Failed to open file '" + pFile + "'.");
        }
    }

    // generate a XML reader for it
    std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(daefile.get()));
    mReader = irr::io::createIrrXMLReader(mIOWrapper.get());
    if (!mReader) {
        ThrowException("Unable to read file, malformed XML");
    }

    // start reading
    ReadContents();

    // read embedded textures
    if (zip_archive && zip_archive->isOpen()) {
        ReadEmbeddedTextures(*zip_archive);
    }
}